

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void VFilter16_SSE2(uint8_t *p,int stride,int thresh,int ithresh,int hev_thresh)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 (*pauVar8) [16];
  undefined1 (*pauVar9) [16];
  undefined1 (*pauVar10) [16];
  undefined1 (*pauVar11) [16];
  int in_ESI;
  undefined1 (*in_RDI) [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  __m128i q2;
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  __m128i p2;
  __m128i mask;
  __m128i t1;
  undefined8 uVar16;
  __m128i *q1_00;
  __m128i *q0_00;
  __m128i *p0_00;
  __m128i *p1_00;
  
  pauVar8 = (undefined1 (*) [16])((long)in_RDI - (long)(in_ESI << 2));
  pauVar9 = (undefined1 (*) [16])((long)in_RDI + ((long)in_ESI - (long)(in_ESI << 2)));
  p1_00 = *(__m128i **)*pauVar9;
  uVar1 = *(undefined8 *)(*pauVar9 + 8);
  pauVar10 = (undefined1 (*) [16])((long)in_RDI + ((long)(in_ESI << 1) - (long)(in_ESI << 2)));
  q0_00 = *(__m128i **)*pauVar10;
  p0_00 = *(__m128i **)(*pauVar10 + 8);
  pauVar11 = (undefined1 (*) [16])((long)in_RDI + ((long)(in_ESI * 3) - (long)(in_ESI << 2)));
  uVar16 = *(undefined8 *)*pauVar11;
  q1_00 = *(__m128i **)(*pauVar11 + 8);
  psubusb(*pauVar11,*pauVar10);
  psubusb(*pauVar10,*pauVar11);
  psubusb(*pauVar9,*pauVar8);
  auVar12 = psubusb(*pauVar8,*pauVar9);
  auVar15 = psubusb(*pauVar10,*pauVar9);
  auVar13 = psubusb(*pauVar9,*pauVar10);
  uVar2 = *(undefined8 *)*in_RDI;
  uVar3 = *(undefined8 *)(*in_RDI + 8);
  pauVar8 = (undefined1 (*) [16])(*in_RDI + in_ESI);
  uVar4 = *(undefined8 *)*pauVar8;
  uVar5 = *(undefined8 *)(*pauVar8 + 8);
  pauVar9 = (undefined1 (*) [16])(*in_RDI + (in_ESI << 1));
  uVar6 = *(undefined8 *)*pauVar9;
  uVar7 = *(undefined8 *)(*pauVar9 + 8);
  psubusb(*in_RDI,*pauVar8);
  psubusb(*pauVar8,*in_RDI);
  psubusb(*pauVar9,*(undefined1 (*) [16])(*in_RDI + in_ESI * 3));
  auVar14 = psubusb(*(undefined1 (*) [16])(*in_RDI + in_ESI * 3),*pauVar9);
  psubusb(*pauVar8,*pauVar9);
  psubusb(*pauVar9,*pauVar8);
  ComplexMask_SSE2(p1_00,p0_00,q0_00,q1_00,(int)((ulong)uVar16 >> 0x20),(int)uVar16,auVar14._8_8_);
  DoFilter6_SSE2(auVar12._8_8_,auVar12._0_8_,auVar15._8_8_,auVar15._0_8_,auVar13._8_8_,auVar13._0_8_
                 ,(__m128i *)q2[0],(int)q2[1]);
  *(__m128i **)(*in_RDI + in_ESI * -3) = p1_00;
  *(undefined8 *)((long)(*in_RDI + in_ESI * -3) + 8) = uVar1;
  *(__m128i **)(*in_RDI + in_ESI * -2) = q0_00;
  *(__m128i **)((long)(*in_RDI + in_ESI * -2) + 8) = p0_00;
  *(undefined8 *)(*in_RDI + -in_ESI) = uVar16;
  *(__m128i **)((long)(*in_RDI + -in_ESI) + 8) = q1_00;
  *(undefined8 *)*in_RDI = uVar2;
  *(undefined8 *)(*in_RDI + 8) = uVar3;
  *(undefined8 *)(*in_RDI + in_ESI) = uVar4;
  *(undefined8 *)((long)(*in_RDI + in_ESI) + 8) = uVar5;
  *(undefined8 *)(*in_RDI + (in_ESI << 1)) = uVar6;
  *(undefined8 *)((long)(*in_RDI + (in_ESI << 1)) + 8) = uVar7;
  return;
}

Assistant:

static void VFilter16_SSE2(uint8_t* p, int stride,
                           int thresh, int ithresh, int hev_thresh) {
  __m128i t1;
  __m128i mask;
  __m128i p2, p1, p0, q0, q1, q2;

  // Load p3, p2, p1, p0
  LOAD_H_EDGES4(p - 4 * stride, stride, t1, p2, p1, p0);
  MAX_DIFF1(t1, p2, p1, p0, mask);

  // Load q0, q1, q2, q3
  LOAD_H_EDGES4(p, stride, q0, q1, q2, t1);
  MAX_DIFF2(t1, q2, q1, q0, mask);

  ComplexMask_SSE2(&p1, &p0, &q0, &q1, thresh, ithresh, &mask);
  DoFilter6_SSE2(&p2, &p1, &p0, &q0, &q1, &q2, &mask, hev_thresh);

  // Store
  _mm_storeu_si128((__m128i*)&p[-3 * stride], p2);
  _mm_storeu_si128((__m128i*)&p[-2 * stride], p1);
  _mm_storeu_si128((__m128i*)&p[-1 * stride], p0);
  _mm_storeu_si128((__m128i*)&p[+0 * stride], q0);
  _mm_storeu_si128((__m128i*)&p[+1 * stride], q1);
  _mm_storeu_si128((__m128i*)&p[+2 * stride], q2);
}